

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::AssertHashEqConsistent<int>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this,int *key)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 *puVar7;
  ushort uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  
  uVar12 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
           size_;
  if (1 < uVar12) {
    uVar1 = *key;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)uVar1;
    uVar2 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    if (uVar2 < 0x11) {
      uVar9 = SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
              SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0);
      pauVar13 = (undefined1 (*) [16])
                 (this->settings_).
                 super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
      lVar11 = *(long *)((long)&(this->settings_).
                                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                .value.heap_or_soo_ + 8);
      if (uVar2 < 0xf) {
        if (8 < uVar2) {
          __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x753,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<int, std::basic_string<char>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
        uVar12 = *(ulong *)(*pauVar13 + uVar2) & 0x8080808080808080;
        if (uVar12 != 0x8080808080808080) {
          uVar12 = uVar12 ^ 0x8080808080808080;
          do {
            uVar2 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
              }
            }
            uVar10 = *(uint *)(lVar11 + -0x28 + (uVar2 >> 3 & 0x1fffffff) * 0x28);
            if ((uVar10 == uVar1) &&
               (auVar5._8_8_ = 0,
               auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)uVar10,
               uVar9 != (SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                        SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0)))) {
LAB_002255d8:
              __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xf1b,
                            "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::AssertHashEqConsistent(const int &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>]"
                           );
            }
            uVar12 = uVar12 & uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      else {
        uVar12 = uVar12 >> 1;
        while( true ) {
          auVar4 = *pauVar13;
          uVar10 = (uint)(ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar4[0xf] >> 7) << 0xf);
          if (uVar10 != 0xffff) {
            uVar10 = ~uVar10;
            do {
              uVar3 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              if ((char)(*pauVar13)[uVar3] < '\0') {
                __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x764,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<int, std::basic_string<char>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
              uVar3 = *(uint *)(lVar11 + (ulong)uVar3 * 0x28);
              if ((uVar3 == uVar1) &&
                 (auVar6._8_8_ = 0,
                 auVar6._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)uVar3,
                 uVar9 != (SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
                          SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_002255d8;
              uVar12 = uVar12 - 1;
              uVar8 = (ushort)(uVar10 - 1) & (ushort)uVar10;
              uVar10 = CONCAT22((short)(uVar10 - 1 >> 0x10),uVar8);
            } while (uVar8 != 0);
          }
          if (uVar12 == 0) break;
          lVar11 = lVar11 + 0x280;
          puVar7 = *pauVar13;
          pauVar13 = pauVar13 + 1;
          if (puVar7[0xf] == -1) {
            __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x76b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<int, std::basic_string<char>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
      }
    }
  }
  return;
}

Assistant:

size_t size() const { return size_ >> HasInfozShift(); }